

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall CLI::Option::help_pname_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  ostream *poVar1;
  string local_1f0;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream out;
  ostream local_190 [376];
  Option *local_18;
  Option *this_local;
  
  local_18 = this;
  this_local = (Option *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  get_pname_abi_cxx11_(&local_1c0,this);
  poVar1 = ::std::operator<<(local_190,(string *)&local_1c0);
  help_aftername_abi_cxx11_(&local_1f0,this);
  ::std::operator<<(poVar1,(string *)&local_1f0);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string help_pname() const {
        std::stringstream out;
        out << get_pname() << help_aftername();
        return out.str();
    }